

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::~raft_server(raft_server *this)

{
  raft_server *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> commit_lock;
  unique_lock<std::recursive_mutex> guard;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  raft_server *in_stack_ffffffffffffff90;
  EventAwaiter *pEVar1;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  condition_variable *in_stack_ffffffffffffffc0;
  unique_lock<std::mutex> local_28 [2];
  
  in_RDI->_vptr_raft_server = (_func_int **)&PTR__raft_server_001fd540;
  cancel_global_requests(in_stack_ffffffffffffff90);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_ffffffffffffff90);
  std::unique_lock<std::mutex>::release(local_28);
  iVar2 = 10;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffc0,
             (int *)&stack0xffffffffffffffbc);
  std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
            (in_stack_ffffffffffffffc0,
             (unique_lock<std::mutex> *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),
             (duration<long,_std::ratio<1L,_1000L>_> *)in_RDI);
  cancel_schedulers(in_RDI);
  pEVar1 = in_RDI->bg_append_ea_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    EventAwaiter::~EventAwaiter((EventAwaiter *)0x14aad6);
    operator_delete(pEVar1);
  }
  pEVar1 = in_RDI->ea_sm_commit_exec_in_progress_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    EventAwaiter::~EventAwaiter((EventAwaiter *)0x14ab01);
    operator_delete(pEVar1);
  }
  pEVar1 = in_RDI->ea_follower_log_append_;
  if (pEVar1 != (EventAwaiter *)0x0) {
    EventAwaiter::~EventAwaiter((EventAwaiter *)0x14ab2c);
    operator_delete(pEVar1);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)pEVar1);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)pEVar1);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)pEVar1);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x14ab65);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  ~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)0x14ab76);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  ~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)0x14ab87);
  std::condition_variable::~condition_variable(&in_RDI->ready_to_stop_cv_);
  std::
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  ::~map((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
          *)0x14aba9);
  std::condition_variable::~condition_variable(&in_RDI->commit_cv_);
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x14abcb);
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x14abdc);
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x14abed);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x14abfe);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x14ac0f);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x14ac20);
  std::function<int_()>::~function((function<int_()> *)0x14ac31);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x14ac42);
  std::shared_ptr<nuraft::state_machine>::~shared_ptr((shared_ptr<nuraft::state_machine> *)0x14ac53)
  ;
  std::shared_ptr<nuraft::log_store>::~shared_ptr((shared_ptr<nuraft::log_store> *)0x14ac64);
  std::shared_ptr<nuraft::srv_state>::~shared_ptr((shared_ptr<nuraft::srv_state> *)0x14ac75);
  std::__cxx11::
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::~list((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
           *)0x14ac86);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
  ::~unordered_map((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
                    *)0x14ac97);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>_>
  ::~unordered_map((unordered_map<int,_std::shared_ptr<nuraft::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>_>
                    *)0x14aca8);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  ::~unordered_map((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)0x14acb9);
  std::shared_ptr<nuraft::delayed_task>::~shared_ptr((shared_ptr<nuraft::delayed_task> *)0x14acca);
  std::function<void_()>::~function((function<void_()> *)0x14acdb);
  std::shared_ptr<nuraft::delayed_task_scheduler>::~shared_ptr
            ((shared_ptr<nuraft::delayed_task_scheduler> *)0x14acec);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::~unique_ptr
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)pEVar1);
  std::thread::~thread((thread *)0x14ad0b);
  std::thread::~thread((thread *)0x14ad19);
  std::enable_shared_from_this<nuraft::raft_server>::~enable_shared_from_this
            ((enable_shared_from_this<nuraft::raft_server> *)0x14ad27);
  return;
}

Assistant:

raft_server::~raft_server() {
    // For the case that user does not call shutdown() and directly
    // destroy the current `raft_server` instance.
    cancel_global_requests();

    recur_lock(lock_);
    stopping_ = true;
    std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
    commit_cv_.notify_all();
    std::unique_lock<std::mutex> lock(ready_to_stop_cv_lock_);
    commit_lock.unlock();
    commit_lock.release();
    ready_to_stop_cv_.wait_for(lock, std::chrono::milliseconds(10));
    cancel_schedulers();
    delete bg_append_ea_;
    delete ea_sm_commit_exec_in_progress_;
    delete ea_follower_log_append_;
}